

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

InterfaceHandle __thiscall
helics::CommonCore::registerInput
          (CommonCore *this,LocalFederateId federateID,string_view key,string_view type,
          string_view units)

{
  string_view name;
  string_view string2;
  string_view string1;
  string_view key_00;
  string_view type_00;
  string_view units_00;
  string_view key_01;
  format_args args;
  string_view fmt;
  string_view message;
  uint16_t uVar1;
  uint uVar2;
  __int_type_conflict1 _Var3;
  FederateState *this_00;
  BasicHandleInfo *this_01;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_RCX;
  unsigned_long_long in_RDX;
  undefined4 in_ESI;
  long in_RDI;
  size_t in_R8;
  ActionMessage *in_R9;
  __sv_type _Var4;
  ActionMessage reg;
  unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_> *handle;
  FederateState *fed;
  InterfaceHandle hid;
  atomic<helics::GlobalFederateId> *in_stack_fffffffffffffd18;
  FederateState *in_stack_fffffffffffffd28;
  FederateState *this_02;
  basic_string_view<char,_std::char_traits<char>_> *x;
  value<fmt::v11::context> *this_03;
  action_t in_stack_fffffffffffffd3c;
  ActionMessage *this_04;
  undefined8 in_stack_fffffffffffffd50;
  InterfaceType HandleType;
  CommonCore *in_stack_fffffffffffffd58;
  BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable> *this_05;
  char *in_stack_fffffffffffffd68;
  size_t in_stack_fffffffffffffd80;
  char *in_stack_fffffffffffffd88;
  size_t in_stack_fffffffffffffd90;
  char *in_stack_fffffffffffffd98;
  uint16_t in_stack_fffffffffffffda0;
  GlobalFederateId local_248;
  InterfaceHandle local_244;
  uint16_t local_236;
  uint16_t in_stack_fffffffffffffe14;
  byte in_stack_fffffffffffffe17;
  FederateState *in_stack_fffffffffffffe18;
  string_view in_stack_fffffffffffffe20;
  InterfaceHandle in_stack_fffffffffffffe34;
  string_view in_stack_fffffffffffffe40;
  string_view in_stack_fffffffffffffe50;
  undefined8 uVar5;
  BrokerBase *this_06;
  string_view in_stack_fffffffffffffe88;
  GlobalFederateId in_stack_fffffffffffffe9c;
  size_t local_158;
  ActionMessage *pAStack_150;
  GlobalFederateId local_134;
  basic_string_view<char,_std::char_traits<char>_> *local_130;
  value<fmt::v11::context> *local_128;
  size_t local_120;
  ActionMessage *local_118;
  BaseType local_fc;
  FederateState *local_f8;
  undefined8 local_f0;
  undefined8 in_stack_ffffffffffffff28;
  CommonCore *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  char *in_stack_ffffffffffffff40;
  InterfaceHandle IVar6;
  BaseType BVar7;
  size_t in_stack_ffffffffffffff98;
  size_t sVar8;
  char *pcVar9;
  
  HandleType = (InterfaceType)((ulong)in_stack_fffffffffffffd50 >> 0x38);
  this_05 = (BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable> *)
            &stack0x00000008;
  key_01._M_len._4_4_ = in_stack_ffffffffffffff3c;
  key_01._M_len._0_4_ = in_stack_ffffffffffffff38;
  key_01._M_str = in_stack_ffffffffffffff40;
  this_00 = checkNewInterface(in_stack_ffffffffffffff30,(LocalFederateId)(BaseType)(in_RDX >> 0x20),
                              key_01,(InterfaceType)((ulong)in_stack_ffffffffffffff28 >> 0x38));
  std::atomic::operator_cast_to_GlobalFederateId(in_stack_fffffffffffffd18);
  local_f8 = (FederateState *)(this_05->m_pushLock).super___mutex_base._M_mutex.__align;
  local_f0 = *(undefined8 *)((long)&(this_05->m_pushLock).super___mutex_base._M_mutex + 8);
  uVar1 = FederateState::getInterfaceFlags(in_stack_fffffffffffffd28);
  uVar2 = (uint)uVar1;
  key_00._M_str = in_stack_fffffffffffffd68;
  key_00._M_len = (size_t)this_05;
  type_00._M_str = in_stack_fffffffffffffd88;
  type_00._M_len = in_stack_fffffffffffffd80;
  units_00._M_str = in_stack_fffffffffffffd98;
  units_00._M_len = in_stack_fffffffffffffd90;
  this_02 = local_f8;
  this_01 = (BasicHandleInfo *)
            createBasicHandle(in_stack_fffffffffffffd58,
                              (GlobalFederateId)(BaseType)((ulong)in_RDI >> 0x20),
                              (LocalFederateId)(BaseType)in_RDI,HandleType,key_00,type_00,units_00,
                              in_stack_fffffffffffffda0);
  local_fc = (BaseType)BasicHandleInfo::getInterfaceHandle(this_01);
  local_130 = (basic_string_view<char,_std::char_traits<char>_> *)
              (this_05->m_pushLock).super___mutex_base._M_mutex.__align;
  local_128 = *(value<fmt::v11::context> **)
               ((long)&(this_05->m_pushLock).super___mutex_base._M_mutex + 8);
  local_120 = in_R8;
  local_118 = in_R9;
  IVar6 = (InterfaceHandle)local_fc;
  FederateState::getInterfaceFlags(this_02);
  x = local_130;
  this_03 = local_128;
  FederateState::createInterface
            (in_stack_fffffffffffffe18,in_stack_fffffffffffffe17,in_stack_fffffffffffffe34,
             in_stack_fffffffffffffe20,in_stack_fffffffffffffe40,in_stack_fffffffffffffe50,
             in_stack_fffffffffffffe14);
  _Var3 = std::__atomic_base::operator_cast_to_int((__atomic_base<int> *)x);
  local_158 = local_120;
  pAStack_150 = local_118;
  if (0xb < _Var3) {
    in_stack_fffffffffffffd58 = (CommonCore *)(in_RDI + 8);
    GlobalFederateId::GlobalFederateId(&local_134,(GlobalBrokerId)0x0);
    FederateState::getIdentifier_abi_cxx11_(this_00);
    std::__cxx11::string::operator_cast_to_basic_string_view
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118);
    uVar5 = 0;
    this_06 = (BrokerBase *)0x14;
    pcVar9 = &stack0xffffffffffffff80;
    sVar8 = 0x14;
    ::fmt::v11::detail::value<fmt::v11::context>::
    value<std::basic_string_view<char,_std::char_traits<char>_>,_char,_0>(this_03,x);
    fmt.data_._4_4_ = IVar6.hid;
    fmt.data_._0_4_ = in_ESI;
    fmt.size_ = in_stack_ffffffffffffff98;
    args.field_1.values_ = in_RCX.values_;
    args.desc_ = in_RDX;
    ::fmt::v11::vformat_abi_cxx11_(fmt,args);
    _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_118);
    local_158 = _Var4._M_len;
    pAStack_150 = (ActionMessage *)_Var4._M_str;
    message._M_str = pcVar9;
    message._M_len = sVar8;
    BrokerBase::sendToLogger
              (this_06,in_stack_fffffffffffffe9c,(int)((ulong)uVar5 >> 0x20),
               in_stack_fffffffffffffe88,message,SUB81((ulong)uVar5 >> 0x18,0));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pAStack_150);
  }
  this_04 = (ActionMessage *)&stack0xfffffffffffffdb0;
  ActionMessage::ActionMessage(this_04,in_stack_fffffffffffffd3c);
  local_244.hid = IVar6.hid;
  local_248 = std::atomic<helics::GlobalFederateId>::load(&this_00->global_id,seq_cst);
  local_236 = this_01->flags;
  name._M_str = (char *)pAStack_150;
  name._M_len = local_158;
  BVar7 = local_244.hid;
  ActionMessage::name((ActionMessage *)0x550c7f,name);
  string1._M_len._4_4_ = in_stack_fffffffffffffd3c;
  string1._M_len._0_4_ = uVar2;
  string1._M_str = (char *)this_04;
  string2._M_str = (char *)this_03;
  string2._M_len = (size_t)x;
  ActionMessage::setStringData(pAStack_150,string1,string2);
  gmlc::containers::
  BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>::
  push<helics::ActionMessage>(this_05,(ActionMessage *)in_stack_fffffffffffffd58);
  ActionMessage::~ActionMessage(pAStack_150);
  return (InterfaceHandle)BVar7;
}

Assistant:

InterfaceHandle CommonCore::registerInput(LocalFederateId federateID,
                                          std::string_view key,
                                          std::string_view type,
                                          std::string_view units)
{
    auto* fed = checkNewInterface(federateID, key, InterfaceType::INPUT);
    const auto& handle = createBasicHandle(fed->global_id,
                                           fed->local_id,
                                           InterfaceType::INPUT,
                                           key,
                                           type,
                                           units,
                                           fed->getInterfaceFlags());

    auto hid = handle.getInterfaceHandle();
    fed->createInterface(InterfaceType::INPUT, hid, key, type, units, fed->getInterfaceFlags());

    LOG_INTERFACES(parent_broker_id,
                   fed->getIdentifier(),
                   fmt::format("registering Input {}", key));
    ActionMessage reg(CMD_REG_INPUT);
    reg.source_id = fed->global_id.load();
    reg.source_handle = hid;
    reg.flags = handle.flags;
    reg.name(key);
    reg.setStringData(type, units);

    actionQueue.push(std::move(reg));
    return hid;
}